

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_array_indexOf(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue v_00;
  JSValue v_01;
  JSValue val_00;
  JSValue op2;
  JSValue op2_00;
  JSValue op1;
  JSValue obj_00;
  JSValue op1_00;
  JSValue val_01;
  JSValue obj_01;
  JSValue JVar1;
  int iVar2;
  BOOL BVar3;
  int in_ECX;
  JSValueUnion in_RDI;
  JSValue *in_R8;
  JSValue JVar4;
  int present;
  uint32_t count;
  JSValue *arrp;
  int64_t res;
  int64_t n;
  int64_t len;
  JSValue val;
  JSValue obj;
  JSValue v;
  JSContext *in_stack_fffffffffffffec0;
  JSValueUnion in_stack_fffffffffffffec8;
  JSValueUnion in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed8 [16];
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  JSContext *in_stack_fffffffffffffef0;
  JSValueUnion in_stack_fffffffffffffef8;
  int64_t in_stack_ffffffffffffff00;
  JSStrictEqModeEnum in_stack_ffffffffffffff0c;
  JSValueUnion ctx_00;
  int64_t idx;
  undefined4 in_stack_ffffffffffffff20;
  uint in_stack_ffffffffffffff24;
  JSValueUnion in_stack_ffffffffffffff28;
  int64_t iVar5;
  long lVar6;
  long local_c8;
  long local_c0;
  JSContext *in_stack_ffffffffffffff50;
  JSValueUnion in_stack_ffffffffffffff58;
  JSValueUnion JVar7;
  int64_t in_stack_ffffffffffffff60;
  int64_t iVar8;
  int32_t local_70;
  undefined4 uStack_6c;
  int64_t local_68;
  JSValueUnion local_60;
  int64_t local_58;
  JSValueUnion local_30;
  int64_t local_28;
  undefined4 uStack_c;
  
  val_01.tag = in_stack_ffffffffffffff60;
  val_01.u.float64 = in_stack_ffffffffffffff58.float64;
  JVar4 = JS_ToObject(in_stack_ffffffffffffff50,val_01);
  ctx_00 = JVar4.u;
  idx = JVar4.tag;
  JVar4.u._4_4_ = in_stack_fffffffffffffeec;
  JVar4.u.int32 = in_stack_fffffffffffffee8;
  JVar4.tag = (int64_t)in_stack_fffffffffffffef0;
  JVar7 = ctx_00;
  iVar8 = idx;
  iVar2 = js_get_length64(in_stack_fffffffffffffed8._8_8_,in_stack_fffffffffffffed8._0_8_,JVar4);
  if (iVar2 == 0) {
    iVar5 = -1;
    lVar6 = iVar5;
    if (0 < local_c0) {
      local_c8 = 0;
      if ((1 < in_ECX) &&
         (val_00.tag = in_stack_ffffffffffffff00,
         val_00.u.float64 = in_stack_fffffffffffffef8.float64,
         iVar2 = JS_ToInt64Clamp(in_stack_fffffffffffffef0,
                                 (int64_t *)
                                 CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                                 val_00,in_stack_fffffffffffffed8._8_8_,
                                 in_stack_fffffffffffffed8._0_8_,(int64_t)ctx_00), iVar2 != 0))
      goto LAB_001b05c5;
      obj_01.tag = iVar8;
      obj_01.u.float64 = JVar7.float64;
      BVar3 = js_get_fast_array((JSContext *)in_RDI.ptr,obj_01,(JSValue **)&stack0xffffffffffffff28,
                                (uint32_t *)&stack0xffffffffffffff24);
      if (BVar3 != 0) {
        for (; local_c8 < (long)(ulong)in_stack_ffffffffffffff24; local_c8 = local_c8 + 1) {
          in_stack_fffffffffffffed0 = in_RDI;
          JVar4 = JS_DupValue((JSContext *)in_RDI.ptr,*in_R8);
          in_stack_ffffffffffffff0c = JVar4.tag._4_4_;
          JS_DupValue((JSContext *)in_RDI.ptr,
                      *(JSValue *)((long)in_stack_ffffffffffffff28.ptr + local_c8 * 0x10));
          op1.tag = iVar5;
          op1.u.ptr = in_stack_ffffffffffffff28.ptr;
          op2.tag._0_4_ = in_stack_ffffffffffffff20;
          op2.u = (JSValueUnion)idx;
          op2.tag._4_4_ = in_stack_ffffffffffffff24;
          BVar3 = js_strict_eq2((JSContext *)ctx_00.ptr,op1,op2,in_stack_ffffffffffffff0c);
          lVar6 = local_c8;
          if (BVar3 != 0) goto LAB_001b0490;
        }
      }
      for (; lVar6 = iVar5, local_c8 < local_c0; local_c8 = local_c8 + 1) {
        obj_00.tag = iVar5;
        obj_00.u.ptr = in_stack_ffffffffffffff28.ptr;
        iVar2 = JS_TryGetPropertyInt64
                          ((JSContext *)
                           CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),obj_00,idx,
                           (JSValue *)ctx_00.ptr);
        if (iVar2 < 0) goto LAB_001b05c5;
        if (iVar2 != 0) {
          in_stack_fffffffffffffec8 = in_RDI;
          JS_DupValue((JSContext *)in_RDI.ptr,*in_R8);
          op1_00.tag = iVar5;
          op1_00.u.ptr = in_stack_ffffffffffffff28.ptr;
          op2_00.tag._0_4_ = in_stack_ffffffffffffff20;
          op2_00.u = (JSValueUnion)idx;
          op2_00.tag._4_4_ = in_stack_ffffffffffffff24;
          BVar3 = js_strict_eq2((JSContext *)ctx_00.ptr,op1_00,op2_00,in_stack_ffffffffffffff0c);
          lVar6 = local_c8;
          if (BVar3 != 0) break;
        }
      }
    }
LAB_001b0490:
    v_00.tag = (int64_t)in_stack_fffffffffffffed0.ptr;
    v_00.u.float64 = in_stack_fffffffffffffec8.float64;
    JS_FreeValue(in_stack_fffffffffffffec0,v_00);
    if (lVar6 == (int)lVar6) {
      local_30._4_4_ = uStack_c;
      local_30.int32 = (int)lVar6;
      local_28 = 0;
    }
    else {
      JVar4 = __JS_NewFloat64((JSContext *)in_RDI.ptr,(double)lVar6);
      local_60 = JVar4.u;
      local_30 = local_60;
      local_58 = JVar4.tag;
      local_28 = local_58;
    }
    local_70 = local_30.int32;
    uStack_6c = local_30._4_4_;
    local_68 = local_28;
  }
  else {
LAB_001b05c5:
    v_01.tag = (int64_t)in_stack_fffffffffffffed0.ptr;
    v_01.u.ptr = in_stack_fffffffffffffec8.ptr;
    JS_FreeValue(in_stack_fffffffffffffec0,v_01);
    local_70 = 0;
    local_68 = 6;
  }
  JVar1.u._4_4_ = uStack_6c;
  JVar1.u.int32 = local_70;
  JVar1.tag = local_68;
  return JVar1;
}

Assistant:

static JSValue js_array_indexOf(JSContext *ctx, JSValueConst this_val,
                                int argc, JSValueConst *argv)
{
    JSValue obj, val;
    int64_t len, n, res;
    JSValue *arrp;
    uint32_t count;

    obj = JS_ToObject(ctx, this_val);
    if (js_get_length64(ctx, &len, obj))
        goto exception;

    res = -1;
    if (len > 0) {
        n = 0;
        if (argc > 1) {
            if (JS_ToInt64Clamp(ctx, &n, argv[1], 0, len, len))
                goto exception;
        }
        if (js_get_fast_array(ctx, obj, &arrp, &count)) {
            for (; n < count; n++) {
                if (js_strict_eq2(ctx, JS_DupValue(ctx, argv[0]),
                                  JS_DupValue(ctx, arrp[n]), JS_EQ_STRICT)) {
                    res = n;
                    goto done;
                }
            }
        }
        for (; n < len; n++) {
            int present = JS_TryGetPropertyInt64(ctx, obj, n, &val);
            if (present < 0)
                goto exception;
            if (present) {
                if (js_strict_eq2(ctx, JS_DupValue(ctx, argv[0]), val, JS_EQ_STRICT)) {
                    res = n;
                    break;
                }
            }
        }
    }
 done:
    JS_FreeValue(ctx, obj);
    return JS_NewInt64(ctx, res);

 exception:
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}